

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_connection.cc
# Opt level: O0

void __thiscall iqnet::ssl::Connection::Connection(Connection *this,Socket *s)

{
  Handler fd;
  int iVar1;
  not_initialized *this_00;
  SSL_CTX *ctx;
  SSL *pSVar2;
  exception *peVar3;
  Socket *s_local;
  Connection *this_local;
  
  iqnet::Connection::Connection(&this->super_Connection,s);
  (this->super_Connection).super_Event_handler._vptr_Event_handler =
       (_func_int **)&PTR__Connection_00254470;
  this->ssl_ctx = ssl::ctx;
  if (this->ssl_ctx == (Ctx *)0x0) {
    this_00 = (not_initialized *)__cxa_allocate_exception(0x30);
    not_initialized::not_initialized(this_00);
    __cxa_throw(this_00,&not_initialized::typeinfo,not_initialized::~not_initialized);
  }
  ctx = (SSL_CTX *)Ctx::context(this->ssl_ctx);
  pSVar2 = SSL_new(ctx);
  this->ssl = (SSL *)pSVar2;
  if (this->ssl == (SSL *)0x0) {
    peVar3 = (exception *)__cxa_allocate_exception(0x30);
    exception::exception(peVar3);
    __cxa_throw(peVar3,&exception::typeinfo,exception::~exception);
  }
  pSVar2 = (SSL *)this->ssl;
  fd = Socket::get_handler(&(this->super_Connection).sock);
  iVar1 = SSL_set_fd(pSVar2,fd);
  if (iVar1 == 0) {
    peVar3 = (exception *)__cxa_allocate_exception(0x30);
    exception::exception(peVar3);
    __cxa_throw(peVar3,&exception::typeinfo,exception::~exception);
  }
  return;
}

Assistant:

ssl::Connection::Connection( const Socket& s ):
  iqnet::Connection( s ),
  ssl_ctx( ssl::ctx )
{
  if( !ssl_ctx )
    throw ssl::not_initialized();

  ssl = SSL_new( ssl_ctx->context() );

  if( !ssl )
    throw ssl::exception();

  if( !SSL_set_fd( ssl, static_cast<int>(sock.get_handler()) ) )
    throw ssl::exception();
}